

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O2

int menu_item_right_offset_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *in_value;
  Am_Object local_20;
  Am_Object local_18;
  Am_Widget_Look look;
  
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,in_value);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)self);
  Am_Object::Am_Object(&local_20,&Am_Menu_Bar);
  bVar1 = Am_Object::Is_Instance_Of(&local_18,&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  if (look.value == Am_MOTIF_LOOK_val) {
    iVar2 = 5;
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    iVar2 = 0x13;
    if (bVar1) {
      iVar2 = 5;
    }
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    iVar2 = (uint)bVar1 * 4 + 6;
  }
  return iVar2;
}

Assistant:

Am_Define_Formula(int, menu_item_right_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  bool menuBarItem = false;
  if (self.Get_Owner().Is_Instance_Of(Am_Menu_Bar))
    // is this item in the menu bar
    menuBarItem = true;

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    return 5;

  case Am_WINDOWS_LOOK_val:
    return menuBarItem ? 5 : 19;

  case Am_MACINTOSH_LOOK_val:
    return menuBarItem ? 10 : 6;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return 0; // we should never get here
}